

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

void voronoiAccess3D(uint64_t sha,int x,int y,int z,int *x4,int *y4,int *z4)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined8 local_68;
  
  iVar3 = (x - 2U & 3) * 0x2800;
  local_68 = 0xffffffffffffffff;
  local_80 = 0;
  local_84 = 0;
  local_7c = 0;
  uVar1 = 0;
  do {
    iVar6 = (((int)(x - 2U) >> 2) + 1) - (uint)(uVar1 < 4);
    iVar7 = iVar3 + -0x4800;
    if (3 < uVar1) {
      iVar7 = iVar3 + -0xe800;
    }
    uVar9 = uVar1 >> 1 & 1;
    iVar10 = uVar9 + ((int)(y - 2U) >> 2);
    iVar11 = (uVar1 & 1) + ((int)(z - 2U) >> 2);
    lVar8 = (sha * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * sha + (long)iVar6;
    lVar8 = (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8 + (long)iVar10;
    lVar8 = (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8 + (long)iVar11;
    lVar8 = (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8 + (long)iVar6;
    lVar8 = (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8 + (long)iVar10;
    lVar8 = (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8 + (long)iVar11;
    lVar4 = (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8 + sha;
    lVar8 = (long)(int)(iVar7 + ((uint)((ulong)lVar8 >> 0x18) & 0x3ff) * 0x24);
    lVar5 = (long)(int)((y - 2U & 3) * 0x2800 + -0x4800 + uVar9 * -0xa000 +
                       ((uint)((ulong)lVar4 >> 0x18) & 0x3ff) * 0x24);
    lVar4 = (long)(int)((z - 2U & 3) * 0x2800 + -0x4800 + (uVar1 & 1) * -0xa000 +
                       ((uint)((lVar4 * 0x51f42d4c957f2d + 0x2f767814f) * lVar4 + sha >> 0x18) &
                       0x3ff) * 0x24);
    uVar2 = lVar4 * lVar4 + lVar5 * lVar5 + lVar8 * lVar8;
    if (uVar2 < local_68) {
      local_84 = iVar10;
      local_80 = iVar6;
      local_7c = iVar11;
      local_68 = uVar2;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 8);
  if (x4 != (int *)0x0) {
    *x4 = local_80;
  }
  if (y4 != (int *)0x0) {
    *y4 = local_84;
  }
  if (z4 != (int *)0x0) {
    *z4 = local_7c;
  }
  return;
}

Assistant:

void voronoiAccess3D(uint64_t sha, int x, int y, int z, int *x4, int *y4, int *z4)
{
    x -= 2;
    y -= 2;
    z -= 2;
    int pX = x >> 2;
    int pY = y >> 2;
    int pZ = z >> 2;
    int dx = (x & 3) * 10240;
    int dy = (y & 3) * 10240;
    int dz = (z & 3) * 10240;
    int ax = 0, ay = 0, az = 0;
    uint64_t dmin = (uint64_t)-1;
    int i;

    for (i = 0; i < 8; i++)
    {
        int bx = (i & 4) != 0;
        int by = (i & 2) != 0;
        int bz = (i & 1) != 0;
        int cx = pX + bx;
        int cy = pY + by;
        int cz = pZ + bz;
        int rx, ry, rz;

        getVoronoiCell(sha, cx, cy, cz, &rx, &ry, &rz);

        rx += dx - 40*1024*bx;
        ry += dy - 40*1024*by;
        rz += dz - 40*1024*bz;

        uint64_t d = rx*(uint64_t)rx + ry*(uint64_t)ry + rz*(uint64_t)rz;
        if (d < dmin)
        {
            dmin = d;
            ax = cx;
            ay = cy;
            az = cz;
        }
    }

    if (x4) *x4 = ax;
    if (y4) *y4 = ay;
    if (z4) *z4 = az;
}